

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__csctx_v(stbtt__csctx *c,stbtt_uint8 type,stbtt_int32 x,stbtt_int32 y,stbtt_int32 cx,
                   stbtt_int32 cy,stbtt_int32 cx1,stbtt_int32 cy1)

{
  stbtt_int32 in_ECX;
  stbtt_int32 in_EDX;
  stbtt_uint8 in_SIL;
  stbtt__csctx *in_RDI;
  stbtt_int32 in_R8D;
  stbtt_int32 in_R9D;
  stbtt_int32 in_stack_00000008;
  
  if (in_RDI->bounds == 0) {
    stbtt_setvertex(in_RDI->pvertices + in_RDI->num_vertices,in_SIL,in_EDX,in_ECX,in_R8D,in_R9D);
    in_RDI->pvertices[in_RDI->num_vertices].cx1 = (short)in_stack_00000008;
    in_RDI->pvertices[in_RDI->num_vertices].cy1 = (short)cx;
  }
  else {
    stbtt__track_vertex(in_RDI,in_EDX,in_ECX);
    if (in_SIL == '\x04') {
      stbtt__track_vertex(in_RDI,in_R8D,in_R9D);
      stbtt__track_vertex(in_RDI,in_stack_00000008,cx);
    }
  }
  in_RDI->num_vertices = in_RDI->num_vertices + 1;
  return;
}

Assistant:

static void stbtt__csctx_v(stbtt__csctx *c, stbtt_uint8 type, stbtt_int32 x, stbtt_int32 y, stbtt_int32 cx, stbtt_int32 cy, stbtt_int32 cx1, stbtt_int32 cy1)
{
   if (c->bounds) {
      stbtt__track_vertex(c, x, y);
      if (type == STBTT_vcubic) {
         stbtt__track_vertex(c, cx, cy);
         stbtt__track_vertex(c, cx1, cy1);
      }
   } else {
      stbtt_setvertex(&c->pvertices[c->num_vertices], type, x, y, cx, cy);
      c->pvertices[c->num_vertices].cx1 = (stbtt_int16) cx1;
      c->pvertices[c->num_vertices].cy1 = (stbtt_int16) cy1;
   }
   c->num_vertices++;
}